

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bit_reader_utils.c
# Opt level: O3

uint32_t VP8LReadBits(VP8LBitReader *br,int n_bits)

{
  uint32_t uVar1;
  
  if ((n_bits < 0x19) && (br->eos == 0)) {
    uVar1 = (uint)(br->val >> ((byte)br->bit_pos & 0x3f)) & kBitMask[n_bits];
    br->bit_pos = br->bit_pos + n_bits;
    ShiftBytes(br);
  }
  else {
    br->bit_pos = 0;
    br->eos = 1;
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

uint32_t VP8LReadBits(VP8LBitReader* const br, int n_bits) {
  assert(n_bits >= 0);
  // Flag an error if end_of_stream or n_bits is more than allowed limit.
  if (!br->eos && n_bits <= VP8L_MAX_NUM_BIT_READ) {
    const uint32_t val = VP8LPrefetchBits(br) & kBitMask[n_bits];
    const int new_bits = br->bit_pos + n_bits;
    br->bit_pos = new_bits;
    ShiftBytes(br);
    return val;
  } else {
    VP8LSetEndOfStream(br);
    return 0;
  }
}